

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitems.h
# Opt level: O0

int __thiscall
pbrt::SubsurfaceScatterQueue::Push
          (SubsurfaceScatterQueue *this,Point3f p0,Point3f p1,int depth,Material *material,
          TabulatedBSSRDF bssrdf,SampledWavelengths lambda,SampledSpectrum beta,SampledSpectrum r_u,
          MediumInterface *mediumInterface,Float etaScale,int pixelIndex)

{
  TabulatedBSSRDF *a;
  SampledSpectrum *in_RCX;
  int iVar1;
  GetSetIndirector *in_RDX;
  int in_ESI;
  WorkQueue<pbrt::SubsurfaceScatterWorkItem> *in_RDI;
  int in_R8D;
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM2 [16];
  undefined1 in_XMM4 [16];
  undefined1 in_XMM5 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  GetSetIndirector GVar2;
  Float in_stack_00000078;
  int index;
  MediumInterface *in_stack_fffffffffffffed8;
  SampledWavelengths *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff64;
  GetSetIndirector local_98;
  int local_88;
  int local_84;
  int local_6c;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  Tuple3<pbrt::Point3,_float> local_40;
  Tuple3<pbrt::Point3,_float> local_30;
  Tuple3<pbrt::Point3,_float> local_20;
  Tuple3<pbrt::Point3,_float> local_10;
  
  local_20._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  local_40._0_8_ = vmovlpd_avx(in_XMM2);
  local_50 = vmovlpd_avx(in_XMM4);
  local_48 = vmovlpd_avx(in_XMM5);
  local_60 = vmovlpd_avx(in_XMM6);
  local_58 = vmovlpd_avx(in_XMM7);
  local_84 = in_R8D;
  local_6c = in_ESI;
  local_30._0_8_ = local_40._0_8_;
  local_10._0_8_ = local_20._0_8_;
  local_88 = WorkQueue<pbrt::SubsurfaceScatterWorkItem>::AllocateEntry(in_RDI);
  GVar2 = SOA<pbrt::Point3<float>_>::operator[]
                    (&(in_RDI->super_SOA<pbrt::SubsurfaceScatterWorkItem>).p0,local_88);
  local_98.soa = GVar2.soa;
  local_98.i = GVar2.i;
  SOA<pbrt::Point3<float>_>::GetSetIndirector::operator=(&local_98,(Point3f *)&local_10);
  GVar2 = SOA<pbrt::Point3<float>_>::operator[]
                    (&(in_RDI->super_SOA<pbrt::SubsurfaceScatterWorkItem>).p1,local_88);
  a = (TabulatedBSSRDF *)GVar2.soa;
  iVar1 = GVar2.i;
  SOA<pbrt::Point3<float>_>::GetSetIndirector::operator=
            ((GetSetIndirector *)&stack0xffffffffffffff58,(Point3f *)&local_30);
  (in_RDI->super_SOA<pbrt::SubsurfaceScatterWorkItem>).depth[local_88] = local_6c;
  Material::operator=((Material *)in_RDX,(Material *)in_stack_fffffffffffffed8);
  SOA<pbrt::TabulatedBSSRDF>::operator[]
            (&(in_RDI->super_SOA<pbrt::SubsurfaceScatterWorkItem>).bssrdf,local_88);
  SOA<pbrt::TabulatedBSSRDF>::GetSetIndirector::operator=
            ((GetSetIndirector *)CONCAT44(in_stack_ffffffffffffff64,iVar1),a);
  SOA<pbrt::SampledWavelengths>::operator[]
            (&(in_RDI->super_SOA<pbrt::SubsurfaceScatterWorkItem>).lambda,local_88);
  SOA<pbrt::SampledWavelengths>::GetSetIndirector::operator=
            ((GetSetIndirector *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  SOA<pbrt::SampledSpectrum>::operator[]
            (&(in_RDI->super_SOA<pbrt::SubsurfaceScatterWorkItem>).beta,local_88);
  SOA<pbrt::SampledSpectrum>::GetSetIndirector::operator=((GetSetIndirector *)in_RDI,in_RCX);
  SOA<pbrt::SampledSpectrum>::operator[]
            (&(in_RDI->super_SOA<pbrt::SubsurfaceScatterWorkItem>).r_u,local_88);
  SOA<pbrt::SampledSpectrum>::GetSetIndirector::operator=((GetSetIndirector *)in_RDI,in_RCX);
  SOA<pbrt::MediumInterface>::operator[]
            (&(in_RDI->super_SOA<pbrt::SubsurfaceScatterWorkItem>).mediumInterface,local_88);
  SOA<pbrt::MediumInterface>::GetSetIndirector::operator=(in_RDX,in_stack_fffffffffffffed8);
  (in_RDI->super_SOA<pbrt::SubsurfaceScatterWorkItem>).etaScale[local_88] = in_stack_00000078;
  (in_RDI->super_SOA<pbrt::SubsurfaceScatterWorkItem>).pixelIndex[local_88] = local_84;
  return local_88;
}

Assistant:

PBRT_CPU_GPU
    int Push(Point3f p0, Point3f p1, int depth, Material material, TabulatedBSSRDF bssrdf,
             SampledWavelengths lambda, SampledSpectrum beta, SampledSpectrum r_u,
             MediumInterface mediumInterface, Float etaScale, int pixelIndex) {
        int index = AllocateEntry();
        this->p0[index] = p0;
        this->p1[index] = p1;
        this->depth[index] = depth;
        this->material[index] = material;
        this->bssrdf[index] = bssrdf;
        this->lambda[index] = lambda;
        this->beta[index] = beta;
        this->r_u[index] = r_u;
        this->mediumInterface[index] = mediumInterface;
        this->etaScale[index] = etaScale;
        this->pixelIndex[index] = pixelIndex;
        return index;
    }